

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

Cof_Man_t * Cof_ManCreateLogicSimple(Gia_Man_t *pGia)

{
  long lVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Cof_Man_t *pCVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  int *__ptr;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  int iVar12;
  uint Entry;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Int_t *p;
  long lVar16;
  int iVar17;
  long lVar18;
  
  pCVar4 = (Cof_Man_t *)calloc(1,0x48);
  pCVar4->pGia = pGia;
  iVar17 = pGia->vCis->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar8 = iVar17;
  if (iVar17 - 1U < 0xf) {
    iVar8 = 0x10;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar5->pArray = piVar6;
  pCVar4->vCis = pVVar5;
  iVar8 = pGia->vCos->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar12 = iVar8;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar7->pArray = piVar6;
  pCVar4->vCos = pVVar7;
  uVar2 = pGia->nObjs * 10 + iVar8 * 2 + ~(iVar17 + iVar8) * 4;
  pCVar4->nObjData = uVar2;
  piVar6 = (int *)calloc((long)(int)uVar2,4);
  pCVar4->pObjData = piVar6;
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  if (pGia->nObjs < 1) {
    Entry = 0;
  }
  else {
    iVar17 = 0;
    lVar18 = 8;
    lVar16 = 0;
    Entry = 0;
    do {
      pGVar3 = pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(uint *)(&pGVar3->field_0x0 + lVar18) = Entry;
      uVar10 = (ulong)Entry;
      lVar1 = uVar10 * 4;
      puVar11 = (uint *)(piVar6 + uVar10);
      uVar9 = piVar6[uVar10];
      piVar6[uVar10] = uVar9 & 0xffffff0f;
      uVar9 = uVar9 & 0xf | pGia->pRefs[lVar16] << 8;
      piVar6[uVar10] = uVar9;
      piVar6[uVar10 + 3] = (int)lVar16;
      piVar6[uVar10 + 2] = 0;
      uVar13 = *(ulong *)((long)pGVar3 + lVar18 + -8);
      uVar14 = (uint)uVar13;
      uVar13 = uVar13 & 0x1fffffff;
      iVar8 = (int)uVar13;
      if (uVar13 == 0x1fffffff || (int)uVar14 < 0) {
        if ((int)uVar14 < 0 && iVar8 != 0x1fffffff) {
          uVar13 = (ulong)*(uint *)((long)pGVar3 + (ulong)(uint)(iVar8 << 2) * -3 + lVar18);
          uVar9 = (uint)(lVar1 + uVar13 * -4 >> 2) & 0x7fffffff;
          piVar6[uVar10 + 6] = piVar6[uVar10 + 6] & 0x80000000U | uVar9;
          iVar8 = piVar6[uVar13 + 2];
          piVar6[uVar13 + 2] = iVar8 + 1;
          uVar15 = (ulong)(((uint)piVar6[uVar13] >> 4 & 0xf) + iVar8);
          piVar6[uVar13 + uVar15 + 6] = piVar6[uVar13 + uVar15 + 6] & 0x80000000U | uVar9;
          uVar9 = piVar6[uVar10];
          uVar13 = (ulong)(uVar9 >> 2 & 0x3c);
          *(uint *)((long)puVar11 + uVar13 + 0x18) =
               (*(uint *)((long)puVar11 + uVar13 + 0x18) & 0x7fffffff) +
               (*(uint *)((long)pGVar3 + lVar18 + -8) & 0xe0000000) * 4;
          piVar6[uVar10] = (uVar9 + 0x10 & 0xf0) + (uVar9 & 0xffffff0e) + 1;
          p = pVVar7;
        }
        else {
          if ((~uVar14 & 0x9fffffff) != 0) goto LAB_0066463b;
          *puVar11 = uVar9 | 1;
          p = pVVar5;
        }
        Vec_IntPush(p,Entry);
      }
      else {
        uVar13 = (ulong)*(uint *)((long)pGVar3 + (ulong)(uint)(iVar8 << 2) * -3 + lVar18);
        uVar9 = (uint)(lVar1 + uVar13 * -4 >> 2) & 0x7fffffff;
        piVar6[uVar10 + 6] = piVar6[uVar10 + 6] & 0x80000000U | uVar9;
        iVar17 = piVar6[uVar13 + 2];
        piVar6[uVar13 + 2] = iVar17 + 1;
        uVar15 = (ulong)(((uint)piVar6[uVar13] >> 4 & 0xf) + iVar17);
        piVar6[uVar13 + uVar15 + 6] = piVar6[uVar13 + uVar15 + 6] & 0x80000000U | uVar9;
        uVar9 = piVar6[uVar10];
        uVar14 = *(uint *)((long)pGVar3 + lVar18 + -8);
        piVar6[uVar10] = uVar9 & 0xffffff0f | uVar9 + 0x10 & 0xf0;
        uVar13 = (ulong)(uVar9 >> 2 & 0x3c);
        *(uint *)((long)puVar11 + uVar13 + 0x18) =
             (*(uint *)((long)puVar11 + uVar13 + 0x18) & 0x7fffffff) + (uVar14 & 0xe0000000) * 4;
        uVar15 = (ulong)*(uint *)((long)pGVar3 +
                                 (ulong)((*(uint *)((long)pGVar3 + lVar18 + -4) & 0x1fffffff) << 2)
                                 * -3 + lVar18);
        uVar13 = (ulong)(uVar9 + 0x10 >> 2 & 0x3c);
        uVar9 = (uint)(lVar1 + uVar15 * -4 >> 2) & 0x7fffffff;
        *(uint *)((long)puVar11 + uVar13 + 0x18) =
             *(uint *)((long)puVar11 + uVar13 + 0x18) & 0x80000000 | uVar9;
        iVar17 = piVar6[uVar15 + 2];
        piVar6[uVar15 + 2] = iVar17 + 1;
        uVar13 = (ulong)(((uint)piVar6[uVar15] >> 4 & 0xf) + iVar17);
        piVar6[uVar15 + uVar13 + 6] = piVar6[uVar15 + uVar13 + 6] & 0x80000000U | uVar9;
        uVar9 = piVar6[uVar10];
        uVar13 = *(ulong *)((long)pGVar3 + lVar18 + -8);
        piVar6[uVar10] = uVar9 & 0xffffff0f | uVar9 + 0x10 & 0xf0;
        uVar10 = (ulong)(uVar9 >> 2 & 0x3c);
        *(uint *)((long)puVar11 + uVar10 + 0x18) =
             *(uint *)((long)puVar11 + uVar10 + 0x18) & 0x7fffffff |
             (uint)(uVar13 >> 0x1e) & 0x80000000;
        pCVar4->nNodes = pCVar4->nNodes + 1;
        iVar17 = pCVar4->nObjs;
      }
LAB_0066463b:
      Entry = Entry + (*puVar11 >> 8) + (*puVar11 >> 4 & 0xf) + 6;
      iVar17 = iVar17 + 1;
      pCVar4->nObjs = iVar17;
      lVar16 = lVar16 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar16 < pGia->nObjs);
  }
  if (Entry != uVar2) {
    __assert_fail("iHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                  ,0xb4,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
  }
  __ptr = Gia_ManCreateMuxRefs(pGia);
  uVar2 = pGia->nObjs;
  if (((int)uVar2 < 1) || (pGia->pObjs == (Gia_Obj_t *)0x0)) {
    if (__ptr == (int *)0x0) {
      return pCVar4;
    }
  }
  else {
    puVar11 = &pGia->pObjs->Value;
    uVar13 = 0;
    do {
      uVar10 = (ulong)*puVar11;
      if ((uint)piVar6[uVar10] >> 8 != piVar6[uVar10 + 2]) {
        __assert_fail("pObjLog->nFanouts == pObjLog->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                      ,0xb9,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
      }
      piVar6[uVar10 + 1] = __ptr[uVar13];
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + 3;
    } while (uVar2 != uVar13);
  }
  free(__ptr);
  return pCVar4;
}

Assistant:

Cof_Man_t * Cof_ManCreateLogicSimple( Gia_Man_t * pGia )
{
    Cof_Man_t * p;
    Cof_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;
    int * pMuxRefs;
    int i, iHandle = 0;
    p = ABC_CALLOC( Cof_Man_t, 1 );
    p->pGia = pGia;
    p->vCis = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Cof_Obj_t) / 4) * Gia_ManObjNum(pGia) + 4 * Gia_ManAndNum(pGia) + 2 * Gia_ManCoNum(pGia);
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObj->Value = iHandle;
        pObjLog = Cof_ManObj( p, iHandle );
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->Id       = i;
        pObjLog->Value    = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin1(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC1(pObj);
            p->nNodes++;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCos, iHandle );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCis, iHandle );
        }
        iHandle += Cof_ObjSize( pObjLog );
        p->nObjs++;
    }
    assert( iHandle == p->nObjData );
    pMuxRefs = Gia_ManCreateMuxRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObjLog = Cof_ManObj( p, Gia_ObjHandle(pObj) );
        assert( pObjLog->nFanouts == pObjLog->Value );
        pObjLog->nFanoutsM = pMuxRefs[i];
    }
    ABC_FREE( pMuxRefs );
    return p;
}